

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

char * helicsInputGetPublicationType(HelicsInput ipt)

{
  string *psVar1;
  
  if ((ipt == (HelicsInput)0x0) || (*ipt != 0x3456e052)) {
    psVar1 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar1 = helics::Input::getPublicationType_abi_cxx11_(*(Input **)((long)ipt + 0x18));
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

helics::InputObject* verifyInput(HelicsInput inp, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (inp == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    auto* inpObj = reinterpret_cast<helics::InputObject*>(inp);
    if (inpObj->valid != InputValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    return inpObj;
}